

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void asm_snap_alloc(ASMState *as)

{
  ushort uVar1;
  long lVar2;
  ushort uVar3;
  ushort *puVar4;
  long in_RDI;
  IRRef ref;
  SnapEntry sn;
  MSize nent;
  MSize n;
  SnapEntry *map;
  SnapShot *snap;
  uint local_1c;
  
  puVar4 = (ushort *)
           (*(long *)(*(long *)(in_RDI + 0xf8) + 0x20) + (ulong)*(uint *)(in_RDI + 0xdc) * 8);
  lVar2 = *(long *)(*(long *)(in_RDI + 0xf8) + 0x28);
  uVar1 = *puVar4;
  uVar3 = puVar4[3];
  for (local_1c = 0; local_1c < (byte)uVar3; local_1c = local_1c + 1) {
    if (0x7fff < (*(uint *)(lVar2 + (ulong)uVar1 * 4 + (ulong)local_1c * 4) & 0xffff)) {
      asm_snap_alloc1(_nent,sn);
    }
  }
  return;
}

Assistant:

static void asm_snap_alloc(ASMState *as)
{
  SnapShot *snap = &as->T->snap[as->snapno];
  SnapEntry *map = &as->T->snapmap[snap->mapofs];
  MSize n, nent = snap->nent;
  for (n = 0; n < nent; n++) {
    SnapEntry sn = map[n];
    IRRef ref = snap_ref(sn);
    if (!irref_isk(ref)) {
      asm_snap_alloc1(as, ref);
      if (LJ_SOFTFP && (sn & SNAP_SOFTFPNUM)) {
	lua_assert(irt_type(IR(ref+1)->t) == IRT_SOFTFP);
	asm_snap_alloc1(as, ref+1);
      }
    }
  }
}